

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckEndOfFileNewLine.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckEndOfFileNewLine(Parser *this)

{
  char *pcVar1;
  Parser *this_00;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *this_01;
  value_type *__s;
  long in_RDI;
  char *localval;
  size_t length_1;
  Error info;
  unsigned_long numberOfEmptyLines;
  long i;
  Error error;
  bool hasError;
  char *val;
  size_t length;
  value_type *in_stack_fffffffffffffef8;
  value_type *__x;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff0f;
  undefined1 withoutComments;
  ulong in_stack_ffffffffffffff10;
  Parser *in_stack_ffffffffffffff18;
  string local_98 [32];
  ulong local_78;
  long local_70;
  long local_58;
  long local_50;
  undefined8 local_48;
  string local_40 [39];
  byte local_19;
  char *local_18;
  undefined8 local_10;
  
  *(undefined1 *)(in_RDI + 0x39) = 1;
  local_10 = 0xff;
  local_18 = (char *)operator_new__(0xff);
  snprintf(local_18,0xff,"The file should have only one new line");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x178),local_18);
  if (local_18 != (char *)0x0) {
    operator_delete__(local_18);
  }
  local_19 = 0;
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
  if (*pcVar1 != '\n') {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1ab044);
    std::__cxx11::string::size();
    local_58 = GetLineNumber(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (bool)in_stack_ffffffffffffff0f);
    local_48 = 9;
    local_50 = local_58;
    std::__cxx11::string::operator=(local_40,"No new line at the end of file");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_19 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1ab0d6);
  }
  this_00 = (Parser *)(in_RDI + 0x4f8);
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this_00);
  if (*pcVar1 != ' ') {
    in_stack_ffffffffffffff10 = in_RDI + 0x4f8;
    std::__cxx11::string::size();
    pcVar1 = (char *)std::__cxx11::string::operator[](in_stack_ffffffffffffff10);
    if (*pcVar1 != '\n') goto LAB_001ab3a5;
  }
  local_70 = std::__cxx11::string::size();
  local_78 = 0;
LAB_001ab19b:
  local_70 = local_70 + -1;
  pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
  if ((*pcVar1 == '\n') ||
     (pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8), *pcVar1 == ' ')) {
LAB_001ab204:
    withoutComments = 0 < local_70;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
    withoutComments = false;
    if (*pcVar1 == '\r') goto LAB_001ab204;
  }
  if ((bool)withoutComments != false) {
    pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
    if (*pcVar1 == '\n') {
      local_78 = local_78 + 1;
    }
    goto LAB_001ab19b;
  }
  if (1 < local_78) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1ab285);
    std::__cxx11::string::size();
    this_01 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
              GetLineNumber(this_00,in_stack_ffffffffffffff10,(bool)withoutComments);
    std::__cxx11::string::operator=(local_98,"Number of empty lines at the end of files: ");
    __s = (value_type *)operator_new__(10);
    __x = __s;
    snprintf((char *)__s,10,"%ld",local_78);
    std::__cxx11::string::operator+=(local_98,(char *)__s);
    if (__s != (value_type *)0x0) {
      operator_delete__(__s);
    }
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back(this_01,__x);
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1ab381);
  }
LAB_001ab3a5:
  return (bool)((local_19 ^ 0xff) & 1);
}

Assistant:

bool Parser::CheckEndOfFileNewLine()
{
  m_TestsDone[EOF_NEW_LINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The file should have only one new line");
  m_TestsDescription[EOF_NEW_LINE] = val;
  delete [] val;
  bool hasError = false;

  // Check if the last character is an end of line
  if(m_Buffer[m_Buffer.size()-1] != '\n')
    {
    Error error;
    error.line = this->GetLineNumber(m_Buffer.size()-1,false);
    error.line2 = error.line;
    error.number = EOF_NEW_LINE;
    error.description = "No new line at the end of file";
    m_ErrorList.push_back(error);
    hasError = true;
    }

  // Check the number empty lines at the end of the file
  if((m_Buffer[m_Buffer.size()-1] == ' ') || (m_Buffer[m_Buffer.size()-1] == '\n'))
    {
    long i = static_cast<long>(m_Buffer.size())-1;
    unsigned long numberOfEmptyLines = 0;
    while( ((m_Buffer[i] == '\n') ||  (m_Buffer[i] == ' ') || (m_Buffer[i] == '\r')) && (i>0))
      {
      if(m_Buffer[i] == '\n')
        {
        numberOfEmptyLines++;
        }
      i-=1;
      }

    if(numberOfEmptyLines>1)
      {
      // Maybe should be info and not error
      Error info;
      info.line2 = this->GetLineNumber(m_Buffer.size()-1,false)+1;
      info.line = info.line2-numberOfEmptyLines+2;
      info.number = EOF_NEW_LINE;
      info.description = "Number of empty lines at the end of files: ";
      constexpr size_t length = 10;
      char* localval = new char[length];
      snprintf(localval,length,"%ld",numberOfEmptyLines);
      info.description += localval;
      delete [] localval;
      m_ErrorList.push_back(info);
      }
    }

  return !hasError;
}